

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_gop(h262_gop *gop)

{
  uint *in_RDI;
  
  printf("GOP header:\n");
  printf("\tdrop_frame_flag = %d\n",(ulong)*in_RDI);
  printf("\ttime_code_hours = %d\n",(ulong)in_RDI[1]);
  printf("\ttime_code_minutes = %d\n",(ulong)in_RDI[2]);
  printf("\ttime_code_seconds = %d\n",(ulong)in_RDI[3]);
  printf("\ttime_code_pictures = %d\n",(ulong)in_RDI[4]);
  printf("\tclosed_gop = %d\n",(ulong)in_RDI[5]);
  printf("\tbroken_link = %d\n",(ulong)in_RDI[6]);
  return;
}

Assistant:

void h262_print_gop(struct h262_gop *gop) {
	printf("GOP header:\n");
	printf("\tdrop_frame_flag = %d\n", gop->drop_frame_flag);
	printf("\ttime_code_hours = %d\n", gop->time_code_hours);
	printf("\ttime_code_minutes = %d\n", gop->time_code_minutes);
	printf("\ttime_code_seconds = %d\n", gop->time_code_seconds);
	printf("\ttime_code_pictures = %d\n", gop->time_code_pictures);
	printf("\tclosed_gop = %d\n", gop->closed_gop);
	printf("\tbroken_link = %d\n", gop->broken_link);
}